

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O0

void __thiscall
GdlPass::DebugFsmTable(GdlPass *this,GrcManager *param_2,ostream *strmOut,bool fWorking)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  FsmState *pFVar5;
  ostream *poVar6;
  FsmState *pFVar7;
  byte in_CL;
  ostream *in_RDX;
  long in_RDI;
  uint ifsmc_3;
  int ifsmcValue;
  uint ifsmc_2;
  FsmState *pfstate;
  uint ifs;
  unsigned_long ifsLim;
  uint ifsmc_1;
  uint ifsmc;
  size_t cfsmc;
  ostream *in_stack_ffffffffffffff78;
  FsmState *in_stack_ffffffffffffff80;
  FsmTable *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  ulong local_68;
  uint local_54;
  int local_50;
  uint in_stack_ffffffffffffffb4;
  FsmState *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar8;
  uint local_30;
  uint local_2c;
  
  bVar1 = in_CL & 1;
  if (*(long *)(in_RDI + 0xb0) == 0) {
    std::operator<<(in_RDX,"No fsm\n");
  }
  else {
    sVar4 = FsmTable::NumberOfColumns(*(FsmTable **)(in_RDI + 0xb0));
    if (bVar1 == 0) {
      std::operator<<(in_RDX,"\nFinal Table:            ");
    }
    else {
      std::operator<<(in_RDX,"\nWorking Table:          ");
    }
    for (local_2c = 0; local_2c < sVar4; local_2c = local_2c + 1) {
      OutputNumber(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (int)in_stack_ffffffffffffff88);
    }
    std::operator<<(in_RDX,"\n                          ");
    for (local_30 = 0; local_30 < sVar4; local_30 = local_30 + 1) {
      std::operator<<(in_RDX,"- - - ");
    }
    if (bVar1 == 0) {
      local_68 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x380110));
    }
    else {
      local_68 = FsmTable::RawNumberOfStates((FsmTable *)0x17772c);
    }
    for (uVar8 = 0; uVar8 < local_68; uVar8 = uVar8 + 1) {
      if (bVar1 == 0) {
        in_stack_ffffffffffffff88 = *(FsmTable **)(in_RDI + 0xb0);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x380110),(ulong)uVar8);
        pFVar5 = FsmTable::StateAt(in_stack_ffffffffffffff88,
                                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      }
      else {
        pFVar5 = FsmTable::RawStateAt
                           ((FsmTable *)in_stack_ffffffffffffff80,
                            (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      }
      this_00 = pFVar5;
      poVar6 = std::operator<<(in_RDX,"\n");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar8);
      in_stack_ffffffffffffff80 = (FsmState *)std::operator<<(poVar6,": ");
      iVar3 = FsmState::SlotsMatched(this_00);
      poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff80,iVar3);
      std::operator<<(poVar6,"\n");
      bVar2 = FsmState::HasBeenMerged(this_00);
      if (bVar2) {
        in_stack_ffffffffffffff78 = std::operator<<(in_RDX,"  => state #");
        pFVar5 = FsmState::MergedState(this_00);
        iVar3 = FsmState::WorkIndex(pFVar5);
        std::ostream::operator<<(in_stack_ffffffffffffff78,iVar3);
      }
      else {
        std::operator<<(in_RDX,"                        ");
        for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < sVar4;
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          std::operator<<(in_RDX," ");
          local_50 = FsmState::CellValue(in_stack_ffffffffffffff80,
                                         (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
          if (bVar1 == 0) {
            pFVar7 = FsmTable::RawStateAt
                               ((FsmTable *)in_stack_ffffffffffffff80,
                                (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
            bVar2 = FsmState::HasBeenMerged(pFVar7);
            if (bVar2) {
              pFVar7 = FsmTable::RawStateAt
                                 ((FsmTable *)in_stack_ffffffffffffff80,
                                  (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
              pFVar7 = FsmState::MergedState(pFVar7);
              local_50 = FsmState::WorkIndex(pFVar7);
            }
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3800f8),(long)local_50);
          }
          OutputNumber((ostream *)pFVar5,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       (int)in_stack_ffffffffffffff88);
        }
      }
      FsmState::DebugFsmState
                ((FsmState *)CONCAT44(uVar8,in_stack_ffffffffffffffc0),(ostream *)this_00,
                 in_stack_ffffffffffffffb4);
    }
    std::operator<<(in_RDX,"\n                          ");
    for (local_54 = 0; local_54 < sVar4; local_54 = local_54 + 1) {
      std::operator<<(in_RDX,"- - - ");
    }
    std::operator<<(in_RDX,"\n\n");
  }
  return;
}

Assistant:

void GdlPass::DebugFsmTable(GrcManager * /*pcman*/, std::ostream & strmOut, bool fWorking)
{
	if (m_pfsm == NULL)
	{
		strmOut << "No fsm\n";
		return;
	}

	auto const cfsmc = m_pfsm->NumberOfColumns();
	if (fWorking)
		strmOut << "\nWorking Table:          ";
	else
		strmOut << "\nFinal Table:            ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)	// column headers
		OutputNumber(strmOut, ifsmc, 6);
	strmOut << "\n                          ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
		strmOut << "- - - ";


	auto ifsLim = (fWorking)? m_pfsm->RawNumberOfStates() : m_vifsFinalToWork.size();
	for (auto ifs = 0U; ifs < ifsLim; ++ifs)
	{
		FsmState * pfstate = (fWorking) ?
			m_pfsm->RawStateAt(ifs) :
			m_pfsm->StateAt(m_vifsFinalToWork[ifs]);

		strmOut << "\n" << ifs << ": " << pfstate->SlotsMatched() << "\n";

		if (pfstate->HasBeenMerged())
		{
			Assert(fWorking);
			strmOut << "  => state #" << pfstate->MergedState()->WorkIndex();
		}
		else
		{
			strmOut << "                        ";

			for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
			{
				strmOut << " ";
				int ifsmcValue = pfstate->CellValue(ifsmc);
				if (!fWorking)
				{
					if (m_pfsm->RawStateAt(ifsmcValue)->HasBeenMerged())
						ifsmcValue = m_pfsm->RawStateAt(ifsmcValue)->MergedState()->WorkIndex();
					ifsmcValue = m_vifsWorkToFinal[ifsmcValue];
				}
				OutputNumber(strmOut, ifsmcValue, 5);
			}
		}

		pfstate->DebugFsmState(strmOut, ifs);
	}

	strmOut << "\n                          ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
		strmOut << "- - - ";
	strmOut << "\n\n";
}